

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_sequential_decoder.cc
# Opt level: O2

bool __thiscall
draco::MeshSequentialDecoder::CreateAttributesDecoder
          (MeshSequentialDecoder *this,int32_t att_decoder_id)

{
  ValueType VVar1;
  bool bVar2;
  tuple<draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
  this_00;
  pointer *__ptr;
  __uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
  local_28;
  _Head_base<0UL,_draco::PointsSequencer_*,_false> local_20;
  
  this_00.
  super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
  .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
        )operator_new(0x80);
  local_20._M_head_impl = (PointsSequencer *)operator_new(0x18);
  VVar1 = ((this->super_MeshDecoder).super_PointCloudDecoder.point_cloud_)->num_points_;
  (local_20._M_head_impl)->out_point_ids_ =
       (vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
        *)0x0;
  (local_20._M_head_impl)->_vptr_PointsSequencer = (_func_int **)&PTR__PointsSequencer_0017c338;
  *(ValueType *)&local_20._M_head_impl[1]._vptr_PointsSequencer = VVar1;
  SequentialAttributeDecodersController::SequentialAttributeDecodersController
            ((SequentialAttributeDecodersController *)
             this_00.
             super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
             .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl,
             (unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_> *)
             &local_20);
  local_28._M_t.
  super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
  .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl =
       (tuple<draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
        )(tuple<draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
          )this_00.
           super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
           .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl;
  bVar2 = PointCloudDecoder::SetAttributesDecoder
                    ((PointCloudDecoder *)this,att_decoder_id,
                     (unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
                      *)&local_28);
  if ((_Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
       )local_28._M_t.
        super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
        .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl !=
      (AttributesDecoderInterface *)0x0) {
    (**(code **)(*(long *)local_28._M_t.
                          super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                          .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>.
                          _M_head_impl + 8))();
  }
  local_28._M_t.
  super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
  .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl =
       (tuple<draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
        )(_Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
          )0x0;
  if (local_20._M_head_impl != (PointsSequencer *)0x0) {
    (*(local_20._M_head_impl)->_vptr_PointsSequencer[1])();
  }
  return bVar2;
}

Assistant:

bool MeshSequentialDecoder::CreateAttributesDecoder(int32_t att_decoder_id) {
  // Always create the basic attribute decoder.
  return SetAttributesDecoder(
      att_decoder_id,
      std::unique_ptr<AttributesDecoder>(
          new SequentialAttributeDecodersController(
              std::unique_ptr<PointsSequencer>(
                  new LinearSequencer(point_cloud()->num_points())))));
}